

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-sampling.cpp
# Opt level: O2

void llama_sampler_typical_apply(llama_sampler *smpl,llama_token_data_array *cur_p)

{
  float *pfVar1;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  __first;
  pointer __last;
  pointer plVar2;
  size_t i_2;
  unsigned_long uVar3;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  __i;
  long lVar4;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  __last_00;
  size_t i_1;
  long lVar5;
  size_t i;
  ulong uVar6;
  ulong uVar7;
  float fVar8;
  float fVar9;
  float local_88;
  vector<unsigned_long,_std::allocator<unsigned_long>_> indices;
  vector<llama_token_data,_std::allocator<llama_token_data>_> cur_p_new;
  vector<float,_std::allocator<float>_> shifted_scores;
  
  pfVar1 = (float *)smpl->ctx;
  if (*pfVar1 < 1.0) {
    llama_sampler_softmax_impl(cur_p);
    local_88 = 0.0;
    lVar5 = 8;
    for (uVar6 = 0; uVar7 = cur_p->size, uVar6 < uVar7; uVar6 = uVar6 + 1) {
      fVar9 = *(float *)((long)&cur_p->data->id + lVar5);
      fVar8 = logf(fVar9);
      local_88 = local_88 - fVar8 * fVar9;
      lVar5 = lVar5 + 0xc;
    }
    shifted_scores.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
    ._M_start = (pointer)0x0;
    shifted_scores.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
    ._M_finish = (pointer)0x0;
    shifted_scores.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
    ._M_end_of_storage = (pointer)0x0;
    lVar5 = 8;
    for (uVar6 = 0; uVar6 < uVar7; uVar6 = uVar6 + 1) {
      fVar9 = logf(*(float *)((long)&cur_p->data->id + lVar5));
      indices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start._0_4_ = ABS(-fVar9 - local_88);
      std::vector<float,_std::allocator<float>_>::push_back
                (&shifted_scores,(value_type_conflict5 *)&indices);
      uVar7 = cur_p->size;
      lVar5 = lVar5 + 0xc;
    }
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              (&indices,uVar7,(allocator_type *)&cur_p_new);
    __last = indices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish;
    __first._M_current._4_4_ =
         indices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_start._4_4_;
    __first._M_current._0_4_ =
         indices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_start._0_4_;
    uVar3 = 0;
    for (lVar5 = 0;
        (pointer)((long)__first._M_current + lVar5) !=
        indices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish; lVar5 = lVar5 + 8) {
      __first._M_current[uVar3] = uVar3;
      uVar3 = uVar3 + 1;
    }
    if (__first._M_current !=
        indices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      lVar4 = (long)indices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_finish - (long)__first._M_current;
      uVar6 = lVar4 >> 3;
      lVar5 = 0x3f;
      if (uVar6 != 0) {
        for (; uVar6 >> lVar5 == 0; lVar5 = lVar5 + -1) {
        }
      }
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<llama_sampler_typical_apply(llama_sampler*,llama_token_data_array*)::__0>>
                (__first,(__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                          )indices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                           ._M_impl.super__Vector_impl_data._M_finish,
                 (ulong)(((uint)lVar5 ^ 0x3f) * 2) ^ 0x7e,
                 (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ggerganov[P]llama_src_llama_sampling_cpp:898:47)>
                  )&shifted_scores);
      if (lVar4 < 0x81) {
        std::
        __insertion_sort<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__ops::_Iter_comp_iter<llama_sampler_typical_apply(llama_sampler*,llama_token_data_array*)::__0>>
                  (__first,(__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                            )__last,
                   (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ggerganov[P]llama_src_llama_sampling_cpp:898:47)>
                    )&shifted_scores);
      }
      else {
        __last_00._M_current = __first._M_current + 0x10;
        std::
        __insertion_sort<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__ops::_Iter_comp_iter<llama_sampler_typical_apply(llama_sampler*,llama_token_data_array*)::__0>>
                  (__first,__last_00,
                   (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ggerganov[P]llama_src_llama_sampling_cpp:898:47)>
                    )&shifted_scores);
        for (; __last_00._M_current != __last; __last_00._M_current = __last_00._M_current + 1) {
          std::
          __unguarded_linear_insert<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__ops::_Val_comp_iter<llama_sampler_typical_apply(llama_sampler*,llama_token_data_array*)::__0>>
                    (__last_00,
                     (_Val_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ggerganov[P]llama_src_llama_sampling_cpp:898:47)>
                      )&shifted_scores);
        }
      }
    }
    uVar7 = (long)indices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            CONCAT44(indices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_start._4_4_,
                     indices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_start._0_4_) >> 3;
    fVar9 = 0.0;
    for (uVar6 = 0; uVar7 != uVar6; uVar6 = uVar6 + 1) {
      fVar9 = fVar9 + cur_p->data
                      [*(long *)(CONCAT44(indices.
                                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                          ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                          indices.
                                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                          ._M_impl.super__Vector_impl_data._M_start._0_4_) +
                                uVar6 * 8)].p;
      if ((*pfVar1 <= fVar9 && fVar9 != *pfVar1) && (*(long *)(pfVar1 + 2) - 1U <= uVar6)) {
        uVar7 = uVar6 + 1;
        break;
      }
    }
    cur_p_new.super__Vector_base<llama_token_data,_std::allocator<llama_token_data>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    cur_p_new.super__Vector_base<llama_token_data,_std::allocator<llama_token_data>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    cur_p_new.super__Vector_base<llama_token_data,_std::allocator<llama_token_data>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    for (uVar6 = 0; uVar7 != uVar6; uVar6 = uVar6 + 1) {
      std::vector<llama_token_data,_std::allocator<llama_token_data>_>::push_back
                (&cur_p_new,
                 cur_p->data +
                 *(long *)(CONCAT44(indices.
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                    indices.
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    ._M_impl.super__Vector_impl_data._M_start._0_4_) + uVar6 * 8));
    }
    plVar2 = cur_p_new.super__Vector_base<llama_token_data,_std::allocator<llama_token_data>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if ((long)cur_p_new.super__Vector_base<llama_token_data,_std::allocator<llama_token_data>_>.
              _M_impl.super__Vector_impl_data._M_finish -
        (long)cur_p_new.super__Vector_base<llama_token_data,_std::allocator<llama_token_data>_>.
              _M_impl.super__Vector_impl_data._M_start != 0) {
      memmove(cur_p->data,
              cur_p_new.super__Vector_base<llama_token_data,_std::allocator<llama_token_data>_>.
              _M_impl.super__Vector_impl_data._M_start,
              (long)cur_p_new.
                    super__Vector_base<llama_token_data,_std::allocator<llama_token_data>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)cur_p_new.
                    super__Vector_base<llama_token_data,_std::allocator<llama_token_data>_>._M_impl.
                    super__Vector_impl_data._M_start);
      plVar2 = cur_p_new.super__Vector_base<llama_token_data,_std::allocator<llama_token_data>_>.
               _M_impl.super__Vector_impl_data._M_finish;
    }
    cur_p->size = ((long)plVar2 -
                  (long)cur_p_new.
                        super__Vector_base<llama_token_data,_std::allocator<llama_token_data>_>.
                        _M_impl.super__Vector_impl_data._M_start) / 0xc;
    cur_p->sorted = false;
    std::_Vector_base<llama_token_data,_std::allocator<llama_token_data>_>::~_Vector_base
              (&cur_p_new.super__Vector_base<llama_token_data,_std::allocator<llama_token_data>_>);
    std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
              (&indices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
    std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
              (&shifted_scores.super__Vector_base<float,_std::allocator<float>_>);
  }
  return;
}

Assistant:

static void llama_sampler_typical_apply(struct llama_sampler * smpl, llama_token_data_array * cur_p) {
    const auto * ctx = (llama_sampler_typical *) smpl->ctx;

    // Reference implementation:
    // https://github.com/huggingface/transformers/compare/main...cimeister:typical-sampling:typical-pr
    if (ctx->p >= 1.0f) {
        return;
    }

    // Compute the softmax of logits and calculate entropy
    llama_sampler_softmax_impl(cur_p);

    float entropy = 0.0f;
    for (size_t i = 0; i < cur_p->size; ++i) {
        entropy += -cur_p->data[i].p * logf(cur_p->data[i].p);
    }

    // Compute the absolute difference between negative log probability and entropy for each candidate
    std::vector<float> shifted_scores;
    for (size_t i = 0; i < cur_p->size; ++i) {
        float shifted_score = fabsf(-logf(cur_p->data[i].p) - entropy);
        shifted_scores.push_back(shifted_score);
    }

    // Sort tokens based on the shifted_scores and their corresponding indices
    std::vector<size_t> indices(cur_p->size);
    std::iota(indices.begin(), indices.end(), 0);

    std::sort(indices.begin(), indices.end(), [&](size_t a, size_t b) {
        return shifted_scores[a] < shifted_scores[b];
    });

    // Compute the cumulative probabilities
    float cum_sum = 0.0f;
    size_t last_idx = indices.size();

    for (size_t i = 0; i < indices.size(); ++i) {
        size_t idx = indices[i];
        cum_sum += cur_p->data[idx].p;

        // Check if the running sum is greater than typical or if we have kept at least min_keep tokens
        if (cum_sum > ctx->p && i >= ctx->min_keep - 1) {
            last_idx = i + 1;
            break;
        }
    }

    // Resize the output vector to keep only the locally typical tokens
    std::vector<llama_token_data> cur_p_new;
    for (size_t i = 0; i < last_idx; ++i) {
        size_t idx = indices[i];
        cur_p_new.push_back(cur_p->data[idx]);
    }

    // Replace the data in cur_p with the cur_p_new data
    std::copy(cur_p_new.begin(), cur_p_new.end(), cur_p->data);
    cur_p->size = cur_p_new.size();
    cur_p->sorted = false;
}